

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS580314BA.h
# Opt level: O0

int ReadDataMS580314BA(MS580314BA *pMS580314BA,int ind,unsigned_long *pValue)

{
  int iVar1;
  int local_6c;
  uint8 local_68 [2];
  byte local_66;
  byte local_65;
  int nbReadBytes;
  uint8 readbuf [50];
  uint8 local_2b [3];
  unsigned_long *puStack_28;
  uint8 writebuf [3];
  unsigned_long *pValue_local;
  int ind_local;
  MS580314BA *pMS580314BA_local;
  
  local_6c = 0;
  local_2b[0] = 'T';
  local_2b[1] = 0xef;
  local_2b[2] = 3;
  puStack_28 = pValue;
  iVar1 = WriteAllRS232Port(&pMS580314BA->RS232Port,local_2b,3);
  if (iVar1 == 0) {
    mSleep(10);
    iVar1 = ReadRS232Port(&pMS580314BA->RS232Port,local_68,0x32,&local_6c);
    if (iVar1 == 0) {
      if (ind == 0) {
        *puStack_28 = (ulong)local_65 * 0x10000 + (ulong)(byte)nbReadBytes * 0x100 +
                      (ulong)nbReadBytes._1_1_;
      }
      if (ind == 1) {
        *puStack_28 = (ulong)local_66 * 0x10000 + (ulong)local_65 * 0x100 + (ulong)(byte)nbReadBytes
        ;
      }
      pMS580314BA_local._4_4_ = 0;
    }
    else {
      printf("Error reading data from a MS580314BA. \n");
      pMS580314BA_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a MS580314BA. \n");
    pMS580314BA_local._4_4_ = 1;
  }
  return pMS580314BA_local._4_4_;
}

Assistant:

inline int ReadDataMS580314BA(MS580314BA* pMS580314BA, int ind, unsigned long* pValue)
{
	uint8 writebuf[3];
	uint8 readbuf[50];
	int nbReadBytes = 0;
	
	writebuf[0] = (uint8)0x54; // Read or Write multiple bytes for devices without internal address or where address does not require resetting.
	writebuf[1] = (uint8)0xEF; // I2C address
	writebuf[2] = (uint8)0x03; // Number of bytes

	if (WriteAllRS232Port(&pMS580314BA->RS232Port, writebuf, 3) != EXIT_SUCCESS)
	{ 
		printf("Error writing data to a MS580314BA. \n");
		return EXIT_FAILURE;
	}

	mSleep(10);

	if (ReadRS232Port(&pMS580314BA->RS232Port, readbuf, 50, &nbReadBytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a MS580314BA. \n");
		return EXIT_FAILURE;
	}

	//printf("%d  %d  %d  %d  %d  %d  %d  %d \n",buf[0],buf[1],buf[2],buf[3],buf[4],buf[5],buf[6],buf[7]);
	if (ind == 0) { *pValue = readbuf[3] * (unsigned long)65536 + readbuf[4] * (unsigned long)256 + readbuf[5]; }
	if (ind == 1) { *pValue = readbuf[2] * (unsigned long)65536 + readbuf[3] * (unsigned long)256 + readbuf[4]; }
	//printf(" %d  \n",ret);

	return EXIT_SUCCESS;
}